

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

void __thiscall vmips::Unconditional::output(Unconditional *this,ostream *out)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  int iVar2;
  _Atomic_word _Var3;
  undefined4 extraout_var;
  size_t sVar4;
  bool bVar5;
  char *__s;
  
  iVar2 = (*(this->super_Instruction)._vptr_Instruction[1])();
  __s = (char *)CONCAT44(extraout_var,iVar2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  this_00 = (this->block).super___weak_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  _Var3 = this_00->_M_use_count;
  do {
    LOCK();
    iVar2 = this_00->_M_use_count;
    bVar5 = _Var3 == iVar2;
    if (bVar5) {
      this_00->_M_use_count = _Var3 + 1;
      iVar2 = _Var3;
    }
    _Var3 = iVar2;
    UNLOCK();
  } while (!bVar5);
  peVar1 = (this->block).super___weak_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(peVar1->label)._M_dataplus._M_p,(peVar1->label)._M_string_length);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void Unconditional::output(std::ostream &out) const {
    out << name() << " " << block.lock()->label;
}